

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

bool __thiscall FConfigFile::SetSection(FConfigFile *this,char *name,bool allowCreate)

{
  int iVar1;
  FConfigSection *pFVar2;
  
  for (pFVar2 = this->Sections; pFVar2 != (FConfigSection *)0x0; pFVar2 = pFVar2->Next) {
    iVar1 = strcasecmp((pFVar2->SectionName).Chars,name);
    if (iVar1 == 0) break;
  }
  if (allowCreate && pFVar2 == (FConfigSection *)0x0) {
    pFVar2 = NewConfigSection(this,name);
  }
  if (pFVar2 != (FConfigSection *)0x0) {
    this->CurrentSection = pFVar2;
    this->CurrentEntry = pFVar2->RootEntry;
  }
  return pFVar2 != (FConfigSection *)0x0;
}

Assistant:

bool FConfigFile::SetSection (const char *name, bool allowCreate)
{
	FConfigSection *section = FindSection (name);
	if (section == NULL && allowCreate)
	{
		section = NewConfigSection (name);
	}
	if (section != NULL)
	{
		CurrentSection = section;
		CurrentEntry = section->RootEntry;
		return true;
	}
	return false;
}